

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O1

vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
ear::GainCalculatorDirectSpeakersImpl::_findCandidates
          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,GainCalculatorDirectSpeakersImpl *this,
          CartesianSpeakerPosition *pos,bool isLfe,double tol)

{
  pointer *pppVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  type tVar6;
  pointer pCVar7;
  _Alloc_hider _Var8;
  long lVar9;
  iterator __position;
  long *plVar10;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *pvVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  CartesianSpeakerPosition *pCVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  Channel channel;
  RowVector3d cartPosition;
  double local_1f0;
  double local_1e0;
  pair<int,_double> local_1b8;
  long *local_1a8;
  double dStack_1a0;
  long local_198 [2];
  double local_188;
  double dStack_180;
  double local_178;
  char local_170;
  type local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  char local_150;
  type local_148;
  undefined8 uStack_140;
  char local_138;
  type local_130;
  undefined8 uStack_128;
  undefined1 local_120;
  long *local_118;
  double dStack_110;
  long local_108;
  undefined1 local_f8 [128];
  dummy_u local_78;
  bool local_58;
  dummy_u local_50;
  
  pCVar15 = pos;
  pdVar12 = (double *)local_f8;
  for (lVar13 = 0xf; lVar13 != 0; lVar13 = lVar13 + -1) {
    *pdVar12 = pCVar15->X;
    pCVar15 = (CartesianSpeakerPosition *)&pCVar15->XMin;
    pdVar12 = pdVar12 + 1;
  }
  local_f8[0x78] = false;
  bVar17 = (pos->screenEdgeLock).horizontal.super_type.m_initialized == true;
  if (bVar17) {
    local_78.aligner_ = (type)((long)local_f8 + 0x90);
    tVar6 = (pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_.aligner_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_f8 + 0x80),tVar6,
               *(long *)((long)&(pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 8) +
               (long)tVar6);
  }
  local_58 = false;
  bVar18 = (pos->screenEdgeLock).vertical.super_type.m_initialized == true;
  local_f8[0x78] = bVar17;
  if (bVar18) {
    local_50.aligner_ = (type)((long)local_f8 + 0xb8);
    tVar6 = (pos->screenEdgeLock).vertical.super_type.m_storage.dummy_.aligner_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_f8 + 0xa8),tVar6,
               *(long *)((long)&(pos->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 8) +
               (long)tVar6);
  }
  local_58 = bVar18;
  toCartesianVector3d((CartesianSpeakerPosition *)local_f8);
  local_118 = local_1a8;
  dStack_110 = dStack_1a0;
  local_108 = local_198[0];
  if (local_58 == true) {
    if (local_50.aligner_ != (type)((long)local_f8 + 0xb8)) {
      operator_delete((void *)local_50.aligner_,local_50._16_8_ + 1);
    }
    local_58 = false;
  }
  if (local_f8[0x78] == true) {
    if (local_78.aligner_ != (type)((long)local_f8 + 0x90)) {
      operator_delete((void *)local_78.aligner_,local_78._16_8_ + 1);
    }
    local_f8[0x78] = false;
  }
  plVar10 = local_118;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0 = pos->Y;
  uVar19 = SUB84(local_1e0,0);
  uVar21 = (undefined4)((ulong)local_1e0 >> 0x20);
  if ((pos->YMin).super_type.m_initialized != false) {
    dVar3 = (pos->YMin).super_type.m_storage;
    uVar19 = SUB84(dVar3,0);
    uVar21 = (undefined4)((ulong)dVar3 >> 0x20);
  }
  if ((pos->YMax).super_type.m_initialized != false) {
    local_1e0 = (pos->YMax).super_type.m_storage;
  }
  local_1f0 = pos->Z;
  uVar20 = SUB84(local_1f0,0);
  uVar22 = (undefined4)((ulong)local_1f0 >> 0x20);
  if ((pos->ZMin).super_type.m_initialized != false) {
    dVar3 = (pos->ZMin).super_type.m_storage;
    uVar20 = SUB84(dVar3,0);
    uVar22 = (undefined4)((ulong)dVar3 >> 0x20);
  }
  if ((pos->ZMax).super_type.m_initialized != false) {
    local_1f0 = (pos->ZMax).super_type.m_storage;
  }
  if (0 < this->_nChannels) {
    dVar3 = (&pos->X)[(ulong)(pos->XMin).super_type.m_initialized * 2];
    dVar4 = (&pos->X)[(ulong)(pos->XMax).super_type.m_initialized * 4];
    lVar16 = 0;
    lVar13 = 0;
    do {
      pvVar11 = Layout::channels(&this->_layout);
      local_1a8 = local_198;
      pCVar7 = (pvVar11->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
               super__Vector_impl_data._M_start;
      _Var8._M_p = pCVar7[lVar13]._name._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,_Var8._M_p,_Var8._M_p + pCVar7[lVar13]._name._M_string_length)
      ;
      local_178 = pCVar7[lVar13]._polarPosition.distance;
      local_188 = pCVar7[lVar13]._polarPosition.azimuth;
      dStack_180 = pCVar7[lVar13]._polarPosition.elevation;
      local_170 = pCVar7[lVar13]._polarPositionNominal.super_type.m_initialized == true;
      if ((bool)local_170) {
        local_158 = *(undefined8 *)
                     ((long)&pCVar7[lVar13]._polarPositionNominal.super_type.m_storage + 0x10);
        local_168 = pCVar7[lVar13]._polarPositionNominal.super_type.m_storage.dummy_.aligner_;
        uStack_160 = *(undefined8 *)
                      ((long)&pCVar7[lVar13]._polarPositionNominal.super_type.m_storage + 8);
      }
      local_150 = pCVar7[lVar13]._azimuthRange.super_type.m_initialized == true;
      if ((bool)local_150) {
        local_148 = pCVar7[lVar13]._azimuthRange.super_type.m_storage.dummy_.aligner_;
        uStack_140 = *(undefined8 *)((long)&pCVar7[lVar13]._azimuthRange.super_type.m_storage + 8);
      }
      local_138 = pCVar7[lVar13]._elevationRange.super_type.m_initialized == true;
      if ((bool)local_138) {
        local_130 = pCVar7[lVar13]._elevationRange.super_type.m_storage.dummy_.aligner_;
        uStack_128 = *(undefined8 *)((long)&pCVar7[lVar13]._elevationRange.super_type.m_storage + 8)
        ;
      }
      local_120 = pCVar7[lVar13]._isLfe;
      if ((this->_isLfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= lVar13) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x19a,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<bool, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Array<bool, -1, 1>, Level = 1]"
                     );
      }
      if ((this->_isLfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
          m_data[lVar13] == isLfe) {
        pdVar12 = (this->_positions).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
        lVar14 = (this->_positions).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 .m_storage.m_cols;
        if (lVar14 < 0 && pdVar12 != (double *)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                        ,0xb2,
                        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                       );
        }
        lVar9 = (this->_positions).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows;
        if (lVar9 <= lVar13) {
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                        ,0x7a,
                        "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                       );
        }
        if (lVar14 < 1) {
LAB_0014f1a5:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 1>::operator()(Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 1]"
                       );
        }
        pdVar2 = pdVar12 + lVar13;
        dVar5 = *pdVar2;
        if ((dVar3 <= dVar5 + tol) && (dVar5 - tol <= dVar4)) {
          if (lVar14 == 1) goto LAB_0014f1a5;
          if (((double)CONCAT44(uVar21,uVar19) <= pdVar2[lVar9] + tol) &&
             (pdVar2[lVar9] - tol <= local_1e0)) {
            if (lVar14 < 3) goto LAB_0014f1a5;
            if (((double)CONCAT44(uVar22,uVar20) <= pdVar2[lVar9 * 2] + tol) &&
               (pdVar2[lVar9 * 2] - tol <= local_1f0)) {
              if (lVar14 != 3) {
                __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                              "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseBinaryOp.h"
                              ,0x74,
                              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, const Eigen::Matrix<double, 1, 3>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Rhs = const Eigen::Matrix<double, 1, 3>]"
                             );
              }
              local_1b8.second = (dVar5 - (double)plVar10) * (dVar5 - (double)plVar10);
              pdVar12 = (double *)((long)pdVar12 + lVar16 + lVar9 * 8);
              lVar14 = 0;
              do {
                local_1b8.second =
                     local_1b8.second +
                     (*pdVar12 - (&dStack_110)[lVar14]) * (*pdVar12 - (&dStack_110)[lVar14]);
                lVar14 = lVar14 + 1;
                pdVar12 = pdVar12 + lVar9;
              } while (lVar14 != 2);
              local_1b8.second = SQRT(local_1b8.second);
              local_1b8.first = (int)lVar13;
              __position._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
                _M_realloc_insert<std::pair<int,double>>
                          ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                           __return_storage_ptr__,__position,&local_1b8);
              }
              else {
                *(ulong *)__position._M_current = CONCAT44(local_1b8._4_4_,local_1b8.first);
                (__position._M_current)->second = local_1b8.second;
                pppVar1 = &(__return_storage_ptr__->
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *pppVar1 = *pppVar1 + 1;
              }
            }
          }
        }
      }
      if (local_138 == '\x01') {
        local_138 = '\0';
      }
      if (local_150 == '\x01') {
        local_150 = '\0';
      }
      if (local_170 == '\x01') {
        local_170 = '\0';
      }
      if (local_1a8 != local_198) {
        operator_delete(local_1a8,local_198[0] + 1);
      }
      lVar13 = lVar13 + 1;
      lVar16 = lVar16 + 8;
    } while (lVar13 < this->_nChannels);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<int, double>>
  GainCalculatorDirectSpeakersImpl::_findCandidates(
      const CartesianSpeakerPosition& pos, bool isLfe, double tol) {
    Eigen::RowVector3d cartPosition = toCartesianVector3d(pos);
    std::vector<std::pair<int, double>> candidates;

    double XMin = boost::get_optional_value_or(pos.XMin, pos.X);
    double XMax = boost::get_optional_value_or(pos.XMax, pos.X);
    double YMin = boost::get_optional_value_or(pos.YMin, pos.Y);
    double YMax = boost::get_optional_value_or(pos.YMax, pos.Y);
    double ZMin = boost::get_optional_value_or(pos.ZMin, pos.Z);
    double ZMax = boost::get_optional_value_or(pos.ZMax, pos.Z);
    for (int i = 0; i < _nChannels; ++i) {
      Channel channel = _layout.channels()[i];
      if (isLfe == _isLfe[i]) {
        if (_positions.row(i)(0) + tol >= XMin &&
            _positions.row(i)(0) - tol <= XMax &&
            _positions.row(i)(1) + tol >= YMin &&
            _positions.row(i)(1) - tol <= YMax &&
            _positions.row(i)(2) + tol >= ZMin &&
            _positions.row(i)(2) - tol <= ZMax) {
          double distance = (_positions.row(i) - cartPosition).norm();
          candidates.push_back(std::make_pair(i, distance));
        }
      }
    }
    return candidates;
  }